

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatasetBuilder.cpp
# Opt level: O2

void __thiscall DatasetBuilder::save(DatasetBuilder *this,path *db_base,string *fname)

{
  pointer puVar1;
  IndexBuilder *pIVar2;
  pointer pbVar3;
  optional<std::basic_string_view<char,_std::char_traits<char>_>_> fname_cache;
  ostream *poVar4;
  string *filename;
  pointer puVar5;
  pointer pbVar6;
  string fname_list;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  taints;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  uint7 uStack_2a7;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  index_names;
  string ndx_name;
  ofstream of;
  
  index_names._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &index_names._M_t._M_impl.super__Rb_tree_header._M_header;
  index_names._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  index_names._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  index_names._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  puVar1 = (this->indices).
           super__Vector_base<std::unique_ptr<IndexBuilder,_std::default_delete<IndexBuilder>_>,_std::allocator<std::unique_ptr<IndexBuilder,_std::default_delete<IndexBuilder>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  index_names._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       index_names._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (puVar5 = (this->indices).
                super__Vector_base<std::unique_ptr<IndexBuilder,_std::default_delete<IndexBuilder>_>,_std::allocator<std::unique_ptr<IndexBuilder,_std::default_delete<IndexBuilder>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar5 != puVar1; puVar5 = puVar5 + 1) {
    get_index_type_name_abi_cxx11_
              ((string *)&taints,
               ((puVar5->_M_t).
                super___uniq_ptr_impl<IndexBuilder,_std::default_delete<IndexBuilder>_>._M_t.
                super__Tuple_impl<0UL,_IndexBuilder_*,_std::default_delete<IndexBuilder>_>.
                super__Head_base<0UL,_IndexBuilder_*,_false>._M_head_impl)->ntype);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&of,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&taints,".")
    ;
    std::operator+(&ndx_name,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&of,fname);
    std::__cxx11::string::~string((string *)&of);
    std::__cxx11::string::~string((string *)&taints);
    pIVar2 = (puVar5->_M_t).super___uniq_ptr_impl<IndexBuilder,_std::default_delete<IndexBuilder>_>.
             _M_t.super__Tuple_impl<0UL,_IndexBuilder_*,_std::default_delete<IndexBuilder>_>.
             super__Head_base<0UL,_IndexBuilder_*,_false>._M_head_impl;
    std::experimental::filesystem::v1::__cxx11::path::
    path<std::__cxx11::string,std::experimental::filesystem::v1::__cxx11::path>
              ((path *)&taints,&ndx_name);
    std::experimental::filesystem::v1::__cxx11::operator/((path *)&of,db_base,(path *)&taints);
    std::__cxx11::string::string((string *)&fname_list,(string *)&of);
    (*pIVar2->_vptr_IndexBuilder[3])(pIVar2,&fname_list);
    std::__cxx11::string::~string((string *)&fname_list);
    std::experimental::filesystem::v1::__cxx11::path::~path((path *)&of);
    std::experimental::filesystem::v1::__cxx11::path::~path((path *)&taints);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_emplace_unique<std::__cxx11::string&>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&index_names,&ndx_name);
    std::__cxx11::string::~string((string *)&ndx_name);
  }
  std::operator+(&fname_list,"files.",fname);
  std::ofstream::ofstream(&of);
  std::ios::exceptions((int)&of + (int)*(undefined8 *)(_of + -0x18));
  std::experimental::filesystem::v1::__cxx11::path::
  path<std::__cxx11::string,std::experimental::filesystem::v1::__cxx11::path>
            ((path *)&ndx_name,&fname_list);
  std::experimental::filesystem::v1::__cxx11::operator/((path *)&taints,db_base,(path *)&ndx_name);
  std::ofstream::open((char *)&of,taints._M_t._M_impl._0_4_);
  std::experimental::filesystem::v1::__cxx11::path::~path((path *)&taints);
  std::experimental::filesystem::v1::__cxx11::path::~path((path *)&ndx_name);
  pbVar3 = (this->fids).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar6 = (this->fids).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar6 != pbVar3; pbVar6 = pbVar6 + 1) {
    poVar4 = std::operator<<((ostream *)&of,(string *)pbVar6);
    std::operator<<(poVar4,"\n");
  }
  std::ostream::flush();
  taints._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &taints._M_t._M_impl.super__Rb_tree_header._M_header;
  taints._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  taints._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  taints._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  fname_cache.
  super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>._M_payload
  .super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>._M_payload.
  _M_value._M_str = (char *)uStack_2b0;
  fname_cache.
  super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>._M_payload
  .super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>._M_payload.
  _M_value._M_len = local_2b8;
  fname_cache.
  super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>._M_payload
  .super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>._16_8_ =
       (ulong)uStack_2a7 << 8;
  taints._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       taints._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  store_dataset(db_base,fname,&index_names,&fname_list,fname_cache,&taints);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&taints._M_t);
  std::ofstream::~ofstream(&of);
  std::__cxx11::string::~string((string *)&fname_list);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&index_names._M_t);
  return;
}

Assistant:

void DatasetBuilder::save(const fs::path &db_base, const std::string &fname) {
    std::set<std::string> index_names;

    for (auto &ndx : indices) {
        std::string ndx_name =
            get_index_type_name(ndx->index_type()) + "." + fname;
        ndx->save(db_base / ndx_name);
        index_names.emplace(ndx_name);
    }

    std::string fname_list = "files." + fname;

    std::ofstream of;
    of.exceptions(std::ofstream::badbit);
    of.open(db_base / fname_list, std::ofstream::binary);

    for (const std::string &filename : fids) {
        of << filename << "\n";
    }
    of.flush();

    std::set<std::string> taints;
    store_dataset(db_base, fname, index_names, fname_list, std::nullopt,
                  taints);
}